

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

void __thiscall
TPZFMatrix<Fad<float>_>::TimesBetaPlusZ
          (TPZFMatrix<Fad<float>_> *this,Fad<float> *beta,TPZFMatrix<Fad<float>_> *z)

{
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  Fad<float> *pFVar10;
  long lVar11;
  Fad<float> *pFVar12;
  Fad<float> *pFVar13;
  
  lVar11 = (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol *
           (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  if (0 < lVar11) {
    pFVar13 = this->fElem;
    pFVar12 = pFVar13 + lVar11;
    pFVar10 = z->fElem;
    do {
      iVar3 = (beta->dx_).num_elts;
      lVar11 = (long)iVar3;
      uVar4 = (pFVar13->dx_).num_elts;
      uVar9 = (ulong)uVar4;
      fVar1 = beta->val_;
      if (lVar11 == 0) {
        if ((uVar9 != 0) && (0 < (int)uVar4)) {
          pfVar5 = (pFVar13->dx_).ptr_to_data;
          uVar8 = 0;
          do {
            pfVar5[uVar8] = pfVar5[uVar8] * fVar1;
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
      }
      else {
        pfVar5 = (beta->dx_).ptr_to_data;
        if (uVar9 == 0) {
          (pFVar13->dx_).num_elts = iVar3;
          uVar9 = lVar11 * 4;
          if (iVar3 < 0) {
            uVar9 = 0xffffffffffffffff;
          }
          pfVar6 = (float *)operator_new__(uVar9);
          (pFVar13->dx_).ptr_to_data = pfVar6;
          if (0 < iVar3) {
            fVar2 = pFVar13->val_;
            lVar7 = 0;
            do {
              pfVar6[lVar7] = pfVar5[lVar7] * fVar2;
              lVar7 = lVar7 + 1;
            } while (lVar11 != lVar7);
          }
        }
        else if (0 < (int)uVar4) {
          pfVar6 = (pFVar13->dx_).ptr_to_data;
          uVar8 = 0;
          do {
            pfVar6[uVar8] = pFVar13->val_ * pfVar5[uVar8] + pfVar6[uVar8] * fVar1;
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
      }
      pFVar13->val_ = fVar1 * pFVar13->val_;
      iVar3 = (pFVar10->dx_).num_elts;
      lVar11 = (long)iVar3;
      if (lVar11 != 0) {
        uVar4 = (pFVar13->dx_).num_elts;
        pfVar5 = (pFVar10->dx_).ptr_to_data;
        if ((ulong)uVar4 == 0) {
          (pFVar13->dx_).num_elts = iVar3;
          uVar9 = lVar11 * 4;
          if (iVar3 < 0) {
            uVar9 = 0xffffffffffffffff;
          }
          pfVar6 = (float *)operator_new__(uVar9);
          (pFVar13->dx_).ptr_to_data = pfVar6;
          if (0 < iVar3) {
            lVar7 = 0;
            do {
              pfVar6[lVar7] = pfVar5[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar11 != lVar7);
          }
        }
        else if (0 < (int)uVar4) {
          pfVar6 = (pFVar13->dx_).ptr_to_data;
          uVar9 = 0;
          do {
            pfVar6[uVar9] = pfVar5[uVar9] + pfVar6[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar4 != uVar9);
        }
      }
      pFVar13->val_ = pFVar10->val_ + pFVar13->val_;
      pFVar13 = pFVar13 + 1;
      pFVar10 = pFVar10 + 1;
    } while (pFVar13 < pFVar12);
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::TimesBetaPlusZ(const TVar beta,const TPZFMatrix<TVar> &z) {
    // #ifdef USING_ATLAS
    // 	int size = fRow*fCol;
    // 	cblas_dscal(size,beta,fElem,1);
    // 	cblas_daxpy(size,1.,z.fElem,1,fElem,1);
    // #else
    
    TVar * pt = fElem,  *ptlast = fElem + this->fRow*this->fCol;
    TVar * pz = z.fElem;
    //	while(pt < ptlast) *pt++ *= (beta) + *pz++;
    while(pt < ptlast) {
        *pt *= (beta);
        *pt++ += *pz++;
    }
    // #endif
}